

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

void google::protobuf::compiler::anon_unknown_0::GatherOccupiedFieldRanges
               (Descriptor *descriptor,
               set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *ranges,vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *nested_messages)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  _Base_ptr p_Var3;
  iterator __position;
  vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
  *this;
  Type TVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  long lVar7;
  FieldDescriptor *this_00;
  long lVar8;
  Descriptor *nested_desc;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  pair<int,_int> local_70;
  vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
  *local_68;
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = (vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
              *)nested_messages;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (0 < *(int *)(descriptor + 0x2c)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      lVar2 = *(long *)(descriptor + 0x30);
      local_70.first = *(int *)(lVar2 + 0x38 + lVar7);
      local_70.second = local_70.first + 1;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_insert_unique<std::pair<int,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)ranges,&local_70);
      this_00 = (FieldDescriptor *)(lVar2 + lVar7);
      TVar4 = FieldDescriptor::type(this_00);
      if (TVar4 == TYPE_GROUP) {
        local_70 = (pair<int,_int>)FieldDescriptor::message_type(this_00);
        std::
        _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_insert_unique<google::protobuf::Descriptor_const*>
                  ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&local_60,(Descriptor **)&local_70);
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0xa8;
    } while (lVar8 < *(int *)(descriptor + 0x2c));
  }
  if (0 < *(int *)(descriptor + 0x68)) {
    lVar7 = 0;
    do {
      local_70.second = *(int *)(*(long *)(descriptor + 0x70) + 4 + lVar7 * 8);
      local_70.first = *(int *)(*(long *)(descriptor + 0x70) + lVar7 * 8);
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_insert_unique<std::pair<int,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)ranges,&local_70);
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(descriptor + 0x68));
  }
  if (0 < *(int *)(descriptor + 0x88)) {
    lVar7 = 0;
    do {
      local_70.second = *(int *)(*(long *)(descriptor + 0x90) + 4 + lVar7 * 8);
      local_70.first = *(int *)(*(long *)(descriptor + 0x90) + lVar7 * 8);
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_insert_unique<std::pair<int,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)ranges,&local_70);
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(descriptor + 0x88));
  }
  this = local_68;
  if (0 < *(int *)(descriptor + 0x48)) {
    lVar7 = 0;
    do {
      local_70 = (pair<int,_int>)(lVar7 * 0xa8 + *(long *)(descriptor + 0x50));
      p_Var5 = &p_Var1->_M_header;
      for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[(ulong)*(pair<int,_int> *)(p_Var3 + 1) < (ulong)local_70]) {
        if ((ulong)*(pair<int,_int> *)(p_Var3 + 1) >= (ulong)local_70) {
          p_Var5 = p_Var3;
        }
      }
      p_Var6 = p_Var1;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var6 = (_Rb_tree_header *)p_Var5,
         (ulong)local_70 < ((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var6 = p_Var1;
      }
      if (p_Var6 == p_Var1) {
        __position._M_current = *(Descriptor ***)(this + 8);
        if (__position._M_current == *(Descriptor ***)(this + 0x10)) {
          std::
          vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
          ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
                    (this,__position,(Descriptor **)&local_70);
        }
        else {
          *__position._M_current = (Descriptor *)local_70;
          *(long *)(this + 8) = *(long *)(this + 8) + 8;
        }
      }
      else {
        GatherOccupiedFieldRanges
                  ((Descriptor *)local_70,ranges,
                   (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)this);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(descriptor + 0x48));
  }
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void GatherOccupiedFieldRanges(
    const Descriptor* descriptor, std::set<FieldRange>* ranges,
    std::vector<const Descriptor*>* nested_messages) {
  std::set<const Descriptor*> groups;
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* fd = descriptor->field(i);
    ranges->insert(FieldRange(fd->number(), fd->number() + 1));
    if (fd->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(fd->message_type());
    }
  }
  for (int i = 0; i < descriptor->extension_range_count(); ++i) {
    ranges->insert(FieldRange(descriptor->extension_range(i)->start,
                              descriptor->extension_range(i)->end));
  }
  for (int i = 0; i < descriptor->reserved_range_count(); ++i) {
    ranges->insert(FieldRange(descriptor->reserved_range(i)->start,
                              descriptor->reserved_range(i)->end));
  }
  // Handle the nested messages/groups in declaration order to make it
  // post-order strict.
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    const Descriptor* nested_desc = descriptor->nested_type(i);
    if (groups.find(nested_desc) != groups.end()) {
      GatherOccupiedFieldRanges(nested_desc, ranges, nested_messages);
    } else {
      nested_messages->push_back(nested_desc);
    }
  }
}